

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr-parser.c
# Opt level: O1

void yydestruct(char *yymsg,yysymbol_kind_t yykind,YYSTYPE *yyvaluep,void *scanner)

{
  undefined4 in_register_00000034;
  
  switch((int)yymsg) {
  case 99:
switchD_0016b0b4_caseD_63:
    free(*(void **)CONCAT44(in_register_00000034,yykind));
    return;
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
    coda_expression_delete(*(coda_expression **)CONCAT44(in_register_00000034,yykind));
    return;
  default:
    switch((int)yymsg) {
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
      goto switchD_0016b0b4_caseD_63;
    default:
      return;
    }
  }
}

Assistant:

static void
yydestruct (const char *yymsg,
            yysymbol_kind_t yykind, YYSTYPE *yyvaluep, void *scanner)
{
  YY_USE (yyvaluep);
  YY_USE (scanner);
  if (!yymsg)
    yymsg = "Deleting";
  YY_SYMBOL_PRINT (yymsg, yykind, yyvaluep, yylocationp);

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  switch (yykind)
    {
    case YYSYMBOL_INT_VALUE: /* INT_VALUE  */
#line 167 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
            { free(((*yyvaluep).stringval)); }
#line 2121 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
        break;

    case YYSYMBOL_FLOAT_VALUE: /* FLOAT_VALUE  */
#line 167 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
            { free(((*yyvaluep).stringval)); }
#line 2127 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
        break;

    case YYSYMBOL_STRING_VALUE: /* STRING_VALUE  */
#line 167 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
            { free(((*yyvaluep).stringval)); }
#line 2133 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
        break;

    case YYSYMBOL_NAME: /* NAME  */
#line 167 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
            { free(((*yyvaluep).stringval)); }
#line 2139 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
        break;

    case YYSYMBOL_INDEX_VAR: /* INDEX_VAR  */
#line 167 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
            { free(((*yyvaluep).stringval)); }
#line 2145 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
        break;

    case YYSYMBOL_identifier: /* identifier  */
#line 167 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
            { free(((*yyvaluep).stringval)); }
#line 2151 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
        break;

    case YYSYMBOL_voidexpr: /* voidexpr  */
#line 166 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
            { coda_expression_delete(((*yyvaluep).expr)); }
#line 2157 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
        break;

    case YYSYMBOL_boolexpr: /* boolexpr  */
#line 166 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
            { coda_expression_delete(((*yyvaluep).expr)); }
#line 2163 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
        break;

    case YYSYMBOL_intexpr: /* intexpr  */
#line 166 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
            { coda_expression_delete(((*yyvaluep).expr)); }
#line 2169 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
        break;

    case YYSYMBOL_floatexpr: /* floatexpr  */
#line 166 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
            { coda_expression_delete(((*yyvaluep).expr)); }
#line 2175 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
        break;

    case YYSYMBOL_stringexpr: /* stringexpr  */
#line 166 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
            { coda_expression_delete(((*yyvaluep).expr)); }
#line 2181 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
        break;

    case YYSYMBOL_rootnode: /* rootnode  */
#line 166 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
            { coda_expression_delete(((*yyvaluep).expr)); }
#line 2187 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
        break;

    case YYSYMBOL_nonrootnode: /* nonrootnode  */
#line 166 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
            { coda_expression_delete(((*yyvaluep).expr)); }
#line 2193 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
        break;

    case YYSYMBOL_node: /* node  */
#line 166 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
            { coda_expression_delete(((*yyvaluep).expr)); }
#line 2199 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
        break;

      default:
        break;
    }
  YY_IGNORE_MAYBE_UNINITIALIZED_END
}